

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_posix.c
# Opt level: O1

wchar_t archive_write_disk_set_skip_file(archive *_a,la_int64_t d,la_int64_t i)

{
  int iVar1;
  wchar_t wVar2;
  
  iVar1 = __archive_check_magic(_a,0xc001b0c5,0x7fff,"archive_write_disk_set_skip_file");
  wVar2 = L'\xffffffe2';
  if (iVar1 != -0x1e) {
    _a[1].file_count = 1;
    _a[1].error = (char *)d;
    _a[1].error_string.s = (char *)i;
    wVar2 = L'\0';
  }
  return wVar2;
}

Assistant:

int
archive_write_disk_set_skip_file(struct archive *_a, la_int64_t d, la_int64_t i)
{
	struct archive_write_disk *a = (struct archive_write_disk *)_a;
	archive_check_magic(&a->archive, ARCHIVE_WRITE_DISK_MAGIC,
	    ARCHIVE_STATE_ANY, "archive_write_disk_set_skip_file");
	a->skip_file_set = 1;
	a->skip_file_dev = d;
	a->skip_file_ino = i;
	return (ARCHIVE_OK);
}